

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_opengl.c
# Opt level: O0

void lookup_entry_points(MOJOSHADER_glGetProcAddress lookup,void *d)

{
  PFNGLGETSTRINGPROC p_Var1;
  PFNGLGETERRORPROC p_Var2;
  PFNGLGETINTEGERVPROC p_Var3;
  PFNGLENABLEPROC p_Var4;
  PFNGLDISABLEPROC p_Var5;
  PFNGLGETSTRINGIPROC p_Var6;
  PFNGLDELETESHADERPROC p_Var7;
  PFNGLDELETEPROGRAMPROC p_Var8;
  PFNGLATTACHSHADERPROC p_Var9;
  PFNGLCOMPILESHADERPROC p_Var10;
  PFNGLCREATESHADERPROC p_Var11;
  PFNGLCREATEPROGRAMPROC p_Var12;
  PFNGLDISABLEVERTEXATTRIBARRAYPROC p_Var13;
  PFNGLENABLEVERTEXATTRIBARRAYPROC p_Var14;
  PFNGLGETATTRIBLOCATIONPROC p_Var15;
  PFNGLGETPROGRAMINFOLOGPROC p_Var16;
  PFNGLGETSHADERINFOLOGPROC p_Var17;
  PFNGLGETSHADERIVPROC p_Var18;
  PFNGLGETPROGRAMIVPROC p_Var19;
  PFNGLGETUNIFORMLOCATIONPROC p_Var20;
  PFNGLLINKPROGRAMPROC p_Var21;
  PFNGLSHADERSOURCEPROC p_Var22;
  PFNGLUNIFORM1IPROC p_Var23;
  PFNGLUNIFORM1IVPROC p_Var24;
  PFNGLUNIFORM4FVPROC p_Var25;
  PFNGLUNIFORM4IVPROC p_Var26;
  PFNGLUSEPROGRAMPROC p_Var27;
  PFNGLVERTEXATTRIBPOINTERPROC p_Var28;
  PFNGLDELETEOBJECTARBPROC p_Var29;
  PFNGLATTACHOBJECTARBPROC p_Var30;
  PFNGLCOMPILESHADERARBPROC p_Var31;
  PFNGLCREATEPROGRAMOBJECTARBPROC p_Var32;
  PFNGLCREATESHADEROBJECTARBPROC p_Var33;
  PFNGLGETINFOLOGARBPROC p_Var34;
  PFNGLGETOBJECTPARAMETERIVARBPROC p_Var35;
  PFNGLGETUNIFORMLOCATIONARBPROC p_Var36;
  PFNGLLINKPROGRAMARBPROC p_Var37;
  PFNGLSHADERSOURCEARBPROC p_Var38;
  PFNGLUNIFORM1IARBPROC p_Var39;
  PFNGLUNIFORM1IVARBPROC p_Var40;
  PFNGLUNIFORM4FVARBPROC p_Var41;
  PFNGLUNIFORM4IVARBPROC p_Var42;
  PFNGLUSEPROGRAMOBJECTARBPROC p_Var43;
  PFNGLDISABLEVERTEXATTRIBARRAYARBPROC p_Var44;
  PFNGLENABLEVERTEXATTRIBARRAYARBPROC p_Var45;
  PFNGLGETATTRIBLOCATIONARBPROC p_Var46;
  PFNGLVERTEXATTRIBPOINTERARBPROC p_Var47;
  PFNGLGETPROGRAMIVARBPROC p_Var48;
  PFNGLPROGRAMLOCALPARAMETER4FVARBPROC p_Var49;
  PFNGLDELETEPROGRAMSARBPROC p_Var50;
  PFNGLGENPROGRAMSARBPROC p_Var51;
  PFNGLBINDPROGRAMARBPROC p_Var52;
  PFNGLPROGRAMSTRINGARBPROC p_Var53;
  PFNGLPROGRAMLOCALPARAMETERI4IVNVPROC p_Var54;
  PFNGLVERTEXATTRIBDIVISORARBPROC p_Var55;
  void *d_local;
  MOJOSHADER_glGetProcAddress lookup_local;
  
  p_Var1 = (PFNGLGETSTRINGPROC)loadsym(lookup,d,"glGetString",&ctx->have_core_opengl);
  ctx->glGetString = p_Var1;
  p_Var2 = (PFNGLGETERRORPROC)loadsym(lookup,d,"glGetError",&ctx->have_core_opengl);
  ctx->glGetError = p_Var2;
  p_Var3 = (PFNGLGETINTEGERVPROC)loadsym(lookup,d,"glGetIntegerv",&ctx->have_core_opengl);
  ctx->glGetIntegerv = p_Var3;
  p_Var4 = (PFNGLENABLEPROC)loadsym(lookup,d,"glEnable",&ctx->have_core_opengl);
  ctx->glEnable = p_Var4;
  p_Var5 = (PFNGLDISABLEPROC)loadsym(lookup,d,"glDisable",&ctx->have_core_opengl);
  ctx->glDisable = p_Var5;
  p_Var6 = (PFNGLGETSTRINGIPROC)loadsym(lookup,d,"glGetStringi",&ctx->have_opengl_3);
  ctx->glGetStringi = p_Var6;
  p_Var7 = (PFNGLDELETESHADERPROC)loadsym(lookup,d,"glDeleteShader",&ctx->have_opengl_2);
  ctx->glDeleteShader = p_Var7;
  p_Var8 = (PFNGLDELETEPROGRAMPROC)loadsym(lookup,d,"glDeleteProgram",&ctx->have_opengl_2);
  ctx->glDeleteProgram = p_Var8;
  p_Var9 = (PFNGLATTACHSHADERPROC)loadsym(lookup,d,"glAttachShader",&ctx->have_opengl_2);
  ctx->glAttachShader = p_Var9;
  p_Var10 = (PFNGLCOMPILESHADERPROC)loadsym(lookup,d,"glCompileShader",&ctx->have_opengl_2);
  ctx->glCompileShader = p_Var10;
  p_Var11 = (PFNGLCREATESHADERPROC)loadsym(lookup,d,"glCreateShader",&ctx->have_opengl_2);
  ctx->glCreateShader = p_Var11;
  p_Var12 = (PFNGLCREATEPROGRAMPROC)loadsym(lookup,d,"glCreateProgram",&ctx->have_opengl_2);
  ctx->glCreateProgram = p_Var12;
  p_Var13 = (PFNGLDISABLEVERTEXATTRIBARRAYPROC)
            loadsym(lookup,d,"glDisableVertexAttribArray",&ctx->have_opengl_2);
  ctx->glDisableVertexAttribArray = p_Var13;
  p_Var14 = (PFNGLENABLEVERTEXATTRIBARRAYPROC)
            loadsym(lookup,d,"glEnableVertexAttribArray",&ctx->have_opengl_2);
  ctx->glEnableVertexAttribArray = p_Var14;
  p_Var15 = (PFNGLGETATTRIBLOCATIONPROC)loadsym(lookup,d,"glGetAttribLocation",&ctx->have_opengl_2);
  ctx->glGetAttribLocation = p_Var15;
  p_Var16 = (PFNGLGETPROGRAMINFOLOGPROC)loadsym(lookup,d,"glGetProgramInfoLog",&ctx->have_opengl_2);
  ctx->glGetProgramInfoLog = p_Var16;
  p_Var17 = (PFNGLGETSHADERINFOLOGPROC)loadsym(lookup,d,"glGetShaderInfoLog",&ctx->have_opengl_2);
  ctx->glGetShaderInfoLog = p_Var17;
  p_Var18 = (PFNGLGETSHADERIVPROC)loadsym(lookup,d,"glGetShaderiv",&ctx->have_opengl_2);
  ctx->glGetShaderiv = p_Var18;
  p_Var19 = (PFNGLGETPROGRAMIVPROC)loadsym(lookup,d,"glGetProgramiv",&ctx->have_opengl_2);
  ctx->glGetProgramiv = p_Var19;
  p_Var20 = (PFNGLGETUNIFORMLOCATIONPROC)
            loadsym(lookup,d,"glGetUniformLocation",&ctx->have_opengl_2);
  ctx->glGetUniformLocation = p_Var20;
  p_Var21 = (PFNGLLINKPROGRAMPROC)loadsym(lookup,d,"glLinkProgram",&ctx->have_opengl_2);
  ctx->glLinkProgram = p_Var21;
  p_Var22 = (PFNGLSHADERSOURCEPROC)loadsym(lookup,d,"glShaderSource",&ctx->have_opengl_2);
  ctx->glShaderSource = p_Var22;
  p_Var23 = (PFNGLUNIFORM1IPROC)loadsym(lookup,d,"glUniform1i",&ctx->have_opengl_2);
  ctx->glUniform1i = p_Var23;
  p_Var24 = (PFNGLUNIFORM1IVPROC)loadsym(lookup,d,"glUniform1iv",&ctx->have_opengl_2);
  ctx->glUniform1iv = p_Var24;
  p_Var25 = (PFNGLUNIFORM4FVPROC)loadsym(lookup,d,"glUniform4fv",&ctx->have_opengl_2);
  ctx->glUniform4fv = p_Var25;
  p_Var26 = (PFNGLUNIFORM4IVPROC)loadsym(lookup,d,"glUniform4iv",&ctx->have_opengl_2);
  ctx->glUniform4iv = p_Var26;
  p_Var27 = (PFNGLUSEPROGRAMPROC)loadsym(lookup,d,"glUseProgram",&ctx->have_opengl_2);
  ctx->glUseProgram = p_Var27;
  p_Var28 = (PFNGLVERTEXATTRIBPOINTERPROC)
            loadsym(lookup,d,"glVertexAttribPointer",&ctx->have_opengl_2);
  ctx->glVertexAttribPointer = p_Var28;
  p_Var29 = (PFNGLDELETEOBJECTARBPROC)
            loadsym(lookup,d,"glDeleteObjectARB",&ctx->have_GL_ARB_shader_objects);
  ctx->glDeleteObjectARB = p_Var29;
  p_Var30 = (PFNGLATTACHOBJECTARBPROC)
            loadsym(lookup,d,"glAttachObjectARB",&ctx->have_GL_ARB_shader_objects);
  ctx->glAttachObjectARB = p_Var30;
  p_Var31 = (PFNGLCOMPILESHADERARBPROC)
            loadsym(lookup,d,"glCompileShaderARB",&ctx->have_GL_ARB_shader_objects);
  ctx->glCompileShaderARB = p_Var31;
  p_Var32 = (PFNGLCREATEPROGRAMOBJECTARBPROC)
            loadsym(lookup,d,"glCreateProgramObjectARB",&ctx->have_GL_ARB_shader_objects);
  ctx->glCreateProgramObjectARB = p_Var32;
  p_Var33 = (PFNGLCREATESHADEROBJECTARBPROC)
            loadsym(lookup,d,"glCreateShaderObjectARB",&ctx->have_GL_ARB_shader_objects);
  ctx->glCreateShaderObjectARB = p_Var33;
  p_Var34 = (PFNGLGETINFOLOGARBPROC)
            loadsym(lookup,d,"glGetInfoLogARB",&ctx->have_GL_ARB_shader_objects);
  ctx->glGetInfoLogARB = p_Var34;
  p_Var35 = (PFNGLGETOBJECTPARAMETERIVARBPROC)
            loadsym(lookup,d,"glGetObjectParameterivARB",&ctx->have_GL_ARB_shader_objects);
  ctx->glGetObjectParameterivARB = p_Var35;
  p_Var36 = (PFNGLGETUNIFORMLOCATIONARBPROC)
            loadsym(lookup,d,"glGetUniformLocationARB",&ctx->have_GL_ARB_shader_objects);
  ctx->glGetUniformLocationARB = p_Var36;
  p_Var37 = (PFNGLLINKPROGRAMARBPROC)
            loadsym(lookup,d,"glLinkProgramARB",&ctx->have_GL_ARB_shader_objects);
  ctx->glLinkProgramARB = p_Var37;
  p_Var38 = (PFNGLSHADERSOURCEARBPROC)
            loadsym(lookup,d,"glShaderSourceARB",&ctx->have_GL_ARB_shader_objects);
  ctx->glShaderSourceARB = p_Var38;
  p_Var39 = (PFNGLUNIFORM1IARBPROC)
            loadsym(lookup,d,"glUniform1iARB",&ctx->have_GL_ARB_shader_objects);
  ctx->glUniform1iARB = p_Var39;
  p_Var40 = (PFNGLUNIFORM1IVARBPROC)
            loadsym(lookup,d,"glUniform1ivARB",&ctx->have_GL_ARB_shader_objects);
  ctx->glUniform1ivARB = p_Var40;
  p_Var41 = (PFNGLUNIFORM4FVARBPROC)
            loadsym(lookup,d,"glUniform4fvARB",&ctx->have_GL_ARB_shader_objects);
  ctx->glUniform4fvARB = p_Var41;
  p_Var42 = (PFNGLUNIFORM4IVARBPROC)
            loadsym(lookup,d,"glUniform4ivARB",&ctx->have_GL_ARB_shader_objects);
  ctx->glUniform4ivARB = p_Var42;
  p_Var43 = (PFNGLUSEPROGRAMOBJECTARBPROC)
            loadsym(lookup,d,"glUseProgramObjectARB",&ctx->have_GL_ARB_shader_objects);
  ctx->glUseProgramObjectARB = p_Var43;
  p_Var44 = (PFNGLDISABLEVERTEXATTRIBARRAYARBPROC)
            loadsym(lookup,d,"glDisableVertexAttribArrayARB",&ctx->have_GL_ARB_vertex_shader);
  ctx->glDisableVertexAttribArrayARB = p_Var44;
  p_Var45 = (PFNGLENABLEVERTEXATTRIBARRAYARBPROC)
            loadsym(lookup,d,"glEnableVertexAttribArrayARB",&ctx->have_GL_ARB_vertex_shader);
  ctx->glEnableVertexAttribArrayARB = p_Var45;
  p_Var46 = (PFNGLGETATTRIBLOCATIONARBPROC)
            loadsym(lookup,d,"glGetAttribLocationARB",&ctx->have_GL_ARB_vertex_shader);
  ctx->glGetAttribLocationARB = p_Var46;
  p_Var47 = (PFNGLVERTEXATTRIBPOINTERARBPROC)
            loadsym(lookup,d,"glVertexAttribPointerARB",&ctx->have_GL_ARB_vertex_shader);
  ctx->glVertexAttribPointerARB = p_Var47;
  p_Var47 = (PFNGLVERTEXATTRIBPOINTERARBPROC)
            loadsym(lookup,d,"glVertexAttribPointerARB",&ctx->have_GL_ARB_vertex_program);
  ctx->glVertexAttribPointerARB = p_Var47;
  p_Var48 = (PFNGLGETPROGRAMIVARBPROC)
            loadsym(lookup,d,"glGetProgramivARB",&ctx->have_GL_ARB_vertex_program);
  ctx->glGetProgramivARB = p_Var48;
  p_Var49 = (PFNGLPROGRAMLOCALPARAMETER4FVARBPROC)
            loadsym(lookup,d,"glProgramLocalParameter4fvARB",&ctx->have_GL_ARB_vertex_program);
  ctx->glProgramLocalParameter4fvARB = p_Var49;
  p_Var50 = (PFNGLDELETEPROGRAMSARBPROC)
            loadsym(lookup,d,"glDeleteProgramsARB",&ctx->have_GL_ARB_vertex_program);
  ctx->glDeleteProgramsARB = p_Var50;
  p_Var51 = (PFNGLGENPROGRAMSARBPROC)
            loadsym(lookup,d,"glGenProgramsARB",&ctx->have_GL_ARB_vertex_program);
  ctx->glGenProgramsARB = p_Var51;
  p_Var52 = (PFNGLBINDPROGRAMARBPROC)
            loadsym(lookup,d,"glBindProgramARB",&ctx->have_GL_ARB_vertex_program);
  ctx->glBindProgramARB = p_Var52;
  p_Var53 = (PFNGLPROGRAMSTRINGARBPROC)
            loadsym(lookup,d,"glProgramStringARB",&ctx->have_GL_ARB_vertex_program);
  ctx->glProgramStringARB = p_Var53;
  p_Var54 = (PFNGLPROGRAMLOCALPARAMETERI4IVNVPROC)
            loadsym(lookup,d,"glProgramLocalParameterI4ivNV",&ctx->have_GL_NV_gpu_program4);
  ctx->glProgramLocalParameterI4ivNV = p_Var54;
  p_Var55 = (PFNGLVERTEXATTRIBDIVISORARBPROC)
            loadsym(lookup,d,"glVertexAttribDivisorARB",&ctx->have_GL_ARB_instanced_arrays);
  ctx->glVertexAttribDivisorARB = p_Var55;
  return;
}

Assistant:

static void lookup_entry_points(MOJOSHADER_glGetProcAddress lookup, void *d)
{
    #define DO_LOOKUP(ext, typ, fn) { \
        ctx->fn = (typ) loadsym(lookup, d, #fn, &ctx->have_##ext); \
    }

    DO_LOOKUP(core_opengl, PFNGLGETSTRINGPROC, glGetString);
    DO_LOOKUP(core_opengl, PFNGLGETERRORPROC, glGetError);
    DO_LOOKUP(core_opengl, PFNGLGETINTEGERVPROC, glGetIntegerv);
    DO_LOOKUP(core_opengl, PFNGLENABLEPROC, glEnable);
    DO_LOOKUP(core_opengl, PFNGLDISABLEPROC, glDisable);
    DO_LOOKUP(opengl_3, PFNGLGETSTRINGIPROC, glGetStringi);
    DO_LOOKUP(opengl_2, PFNGLDELETESHADERPROC, glDeleteShader);
    DO_LOOKUP(opengl_2, PFNGLDELETEPROGRAMPROC, glDeleteProgram);
    DO_LOOKUP(opengl_2, PFNGLATTACHSHADERPROC, glAttachShader);
    DO_LOOKUP(opengl_2, PFNGLCOMPILESHADERPROC, glCompileShader);
    DO_LOOKUP(opengl_2, PFNGLCREATESHADERPROC, glCreateShader);
    DO_LOOKUP(opengl_2, PFNGLCREATEPROGRAMPROC, glCreateProgram);
    DO_LOOKUP(opengl_2, PFNGLDISABLEVERTEXATTRIBARRAYPROC, glDisableVertexAttribArray);
    DO_LOOKUP(opengl_2, PFNGLENABLEVERTEXATTRIBARRAYPROC, glEnableVertexAttribArray);
    DO_LOOKUP(opengl_2, PFNGLGETATTRIBLOCATIONPROC, glGetAttribLocation);
    DO_LOOKUP(opengl_2, PFNGLGETPROGRAMINFOLOGPROC, glGetProgramInfoLog);
    DO_LOOKUP(opengl_2, PFNGLGETSHADERINFOLOGPROC, glGetShaderInfoLog);
    DO_LOOKUP(opengl_2, PFNGLGETSHADERIVPROC, glGetShaderiv);
    DO_LOOKUP(opengl_2, PFNGLGETPROGRAMIVPROC, glGetProgramiv);
    DO_LOOKUP(opengl_2, PFNGLGETUNIFORMLOCATIONPROC, glGetUniformLocation);
    DO_LOOKUP(opengl_2, PFNGLLINKPROGRAMPROC, glLinkProgram);
    DO_LOOKUP(opengl_2, PFNGLSHADERSOURCEPROC, glShaderSource);
    DO_LOOKUP(opengl_2, PFNGLUNIFORM1IPROC, glUniform1i);
    DO_LOOKUP(opengl_2, PFNGLUNIFORM1IVPROC, glUniform1iv);
#ifdef MOJOSHADER_FLIP_RENDERTARGET
    DO_LOOKUP(opengl_2, PFNGLUNIFORM1FPROC, glUniform1f);
#endif
    DO_LOOKUP(opengl_2, PFNGLUNIFORM4FVPROC, glUniform4fv);
    DO_LOOKUP(opengl_2, PFNGLUNIFORM4IVPROC, glUniform4iv);
    DO_LOOKUP(opengl_2, PFNGLUSEPROGRAMPROC, glUseProgram);
    DO_LOOKUP(opengl_2, PFNGLVERTEXATTRIBPOINTERPROC, glVertexAttribPointer);
    DO_LOOKUP(GL_ARB_shader_objects, PFNGLDELETEOBJECTARBPROC, glDeleteObjectARB);
    DO_LOOKUP(GL_ARB_shader_objects, PFNGLATTACHOBJECTARBPROC, glAttachObjectARB);
    DO_LOOKUP(GL_ARB_shader_objects, PFNGLCOMPILESHADERARBPROC, glCompileShaderARB);
    DO_LOOKUP(GL_ARB_shader_objects, PFNGLCREATEPROGRAMOBJECTARBPROC, glCreateProgramObjectARB);
    DO_LOOKUP(GL_ARB_shader_objects, PFNGLCREATESHADEROBJECTARBPROC, glCreateShaderObjectARB);
    DO_LOOKUP(GL_ARB_shader_objects, PFNGLGETINFOLOGARBPROC, glGetInfoLogARB);
    DO_LOOKUP(GL_ARB_shader_objects, PFNGLGETOBJECTPARAMETERIVARBPROC, glGetObjectParameterivARB);
    DO_LOOKUP(GL_ARB_shader_objects, PFNGLGETUNIFORMLOCATIONARBPROC, glGetUniformLocationARB);
    DO_LOOKUP(GL_ARB_shader_objects, PFNGLLINKPROGRAMARBPROC, glLinkProgramARB);
    DO_LOOKUP(GL_ARB_shader_objects, PFNGLSHADERSOURCEARBPROC, glShaderSourceARB);
    DO_LOOKUP(GL_ARB_shader_objects, PFNGLUNIFORM1IARBPROC, glUniform1iARB);
    DO_LOOKUP(GL_ARB_shader_objects, PFNGLUNIFORM1IVARBPROC, glUniform1ivARB);
    DO_LOOKUP(GL_ARB_shader_objects, PFNGLUNIFORM4FVARBPROC, glUniform4fvARB);
    DO_LOOKUP(GL_ARB_shader_objects, PFNGLUNIFORM4IVARBPROC, glUniform4ivARB);
    DO_LOOKUP(GL_ARB_shader_objects, PFNGLUSEPROGRAMOBJECTARBPROC, glUseProgramObjectARB);
    DO_LOOKUP(GL_ARB_vertex_shader, PFNGLDISABLEVERTEXATTRIBARRAYARBPROC, glDisableVertexAttribArrayARB);
    DO_LOOKUP(GL_ARB_vertex_shader, PFNGLENABLEVERTEXATTRIBARRAYARBPROC, glEnableVertexAttribArrayARB);
    DO_LOOKUP(GL_ARB_vertex_shader, PFNGLGETATTRIBLOCATIONARBPROC, glGetAttribLocationARB);
    DO_LOOKUP(GL_ARB_vertex_shader, PFNGLVERTEXATTRIBPOINTERARBPROC, glVertexAttribPointerARB);
    DO_LOOKUP(GL_ARB_vertex_program, PFNGLVERTEXATTRIBPOINTERARBPROC, glVertexAttribPointerARB);
    DO_LOOKUP(GL_ARB_vertex_program, PFNGLGETPROGRAMIVARBPROC, glGetProgramivARB);
    DO_LOOKUP(GL_ARB_vertex_program, PFNGLPROGRAMLOCALPARAMETER4FVARBPROC, glProgramLocalParameter4fvARB);
    DO_LOOKUP(GL_ARB_vertex_program, PFNGLDELETEPROGRAMSARBPROC, glDeleteProgramsARB);
    DO_LOOKUP(GL_ARB_vertex_program, PFNGLGENPROGRAMSARBPROC, glGenProgramsARB);
    DO_LOOKUP(GL_ARB_vertex_program, PFNGLBINDPROGRAMARBPROC, glBindProgramARB);
    DO_LOOKUP(GL_ARB_vertex_program, PFNGLPROGRAMSTRINGARBPROC, glProgramStringARB);
    DO_LOOKUP(GL_NV_gpu_program4, PFNGLPROGRAMLOCALPARAMETERI4IVNVPROC, glProgramLocalParameterI4ivNV);
    DO_LOOKUP(GL_ARB_instanced_arrays, PFNGLVERTEXATTRIBDIVISORARBPROC, glVertexAttribDivisorARB);

    #undef DO_LOOKUP
}